

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::
     print<std::basic_string_view<char,std::char_traits<char>>,double_const&,int_const&,char>
               (FILE *f,basic_string_view<char,_std::char_traits<char>_> *format_str,double *args,
               int *args_1)

{
  basic_string_view<char,_std::char_traits<char>_> *f_00;
  char *extraout_RDX;
  remove_reference_t<const_int_&> *in_R8;
  std_string_view<char> s;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  v7 *local_98;
  double local_90;
  string_view local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_int>
  local_78;
  FILE *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_int>
  *vargs;
  int *args_local_1;
  double *args_local;
  basic_string_view<char,_std::char_traits<char>_> *format_str_local;
  FILE *f_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  FILE *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  FILE *local_10;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_int>
           *)args_1;
  args_local_1 = (int *)args;
  args_local = (double *)format_str;
  format_str_local = (basic_string_view<char,_std::char_traits<char>_> *)f;
  make_args_checked<double_const&,int_const&,std::basic_string_view<char,std::char_traits<char>>,char>
            (&local_78,(v7 *)format_str,(basic_string_view<char,_std::char_traits<char>_> *)args,
             (remove_reference_t<const_double_&> *)args_1,in_R8);
  f_00 = format_str_local;
  local_58 = (FILE *)&local_78;
  local_98 = (v7 *)*args_local;
  local_90 = args_local[1];
  s._M_str = extraout_RDX;
  s._M_len = (size_t)local_90;
  local_88 = to_string_view<char,_0>(local_98,s);
  local_28 = &local_a8;
  f_local = local_58;
  local_20 = local_58;
  local_10 = local_58;
  local_18 = local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0x1a,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_58);
  vprint((FILE *)f_00,local_88,(format_args)local_a8);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}